

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FileOptions::InternalSerializeWithCachedSizesToArray
          (FileOptions *this,bool deterministic,uint8 *target)

{
  int iVar1;
  string *psVar2;
  void *pvVar3;
  bool bVar4;
  byte *pbVar5;
  Type *this_00;
  uint8 *puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int index;
  
  uVar9 = (this->_has_bits_).has_bits_[0];
  if ((uVar9 & 1) != 0) {
    psVar2 = (this->java_package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.java_package");
    psVar2 = (this->java_package_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar9 & 2) != 0) {
    psVar2 = (this->java_outer_classname_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.java_outer_classname");
    psVar2 = (this->java_outer_classname_).ptr_;
    *target = 0x42;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((short)uVar9 < 0) {
    uVar8 = (ulong)this->optimize_for_;
    pbVar5 = target + 1;
    *target = 0x48;
    uVar10 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar8 | 0x80;
        uVar10 = uVar8 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar10;
      } while (bVar4);
    }
    *pbVar5 = (byte)uVar10;
    target = pbVar5 + 1;
  }
  if ((char)uVar9 < '\0') {
    bVar4 = this->java_multiple_files_;
    *target = 0x50;
    target[1] = bVar4;
    target = target + 2;
  }
  if ((uVar9 & 4) != 0) {
    psVar2 = (this->go_package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.go_package");
    psVar2 = (this->go_package_).ptr_;
    *target = 0x5a;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar9 >> 10 & 1) != 0) {
    bVar4 = this->cc_generic_services_;
    target[0] = 0x80;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 >> 0xb & 1) != 0) {
    bVar4 = this->java_generic_services_;
    target[0] = 0x88;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 >> 0xc & 1) != 0) {
    bVar4 = this->py_generic_services_;
    target[0] = 0x90;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 >> 8 & 1) != 0) {
    bVar4 = this->java_generate_equals_and_hash_;
    target[0] = 0xa0;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 >> 0xd & 1) != 0) {
    bVar4 = this->deprecated_;
    target[0] = 0xb8;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 >> 9 & 1) != 0) {
    bVar4 = this->java_string_check_utf8_;
    target[0] = 0xd8;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 >> 0xe & 1) != 0) {
    bVar4 = this->cc_enable_arenas_;
    target[0] = 0xf8;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  if ((uVar9 & 8) != 0) {
    psVar2 = (this->objc_class_prefix_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.objc_class_prefix");
    psVar2 = (this->objc_class_prefix_).ptr_;
    target[0] = 0xa2;
    target[1] = 2;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 2);
  }
  if ((uVar9 & 0x10) != 0) {
    psVar2 = (this->csharp_namespace_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.csharp_namespace");
    psVar2 = (this->csharp_namespace_).ptr_;
    target[0] = 0xaa;
    target[1] = 2;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 2);
  }
  if ((uVar9 & 0x20) != 0) {
    psVar2 = (this->swift_prefix_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.swift_prefix");
    psVar2 = (this->swift_prefix_).ptr_;
    target[0] = 0xba;
    target[1] = 2;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 2);
  }
  if ((uVar9 & 0x40) != 0) {
    psVar2 = (this->php_class_prefix_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileOptions.php_class_prefix");
    psVar2 = (this->php_class_prefix_).ptr_;
    target[0] = 0xc2;
    target[1] = 2;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 2);
  }
  iVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xba;
      target[1] = 0x3e;
      pbVar5 = target + 2;
      uVar9 = this_00->_cached_size_;
      uVar7 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar5 = (byte)uVar9 | 0x80;
          uVar7 = uVar9 >> 7;
          pbVar5 = pbVar5 + 1;
          bVar4 = 0x3fff < uVar9;
          uVar9 = uVar7;
        } while (bVar4);
      }
      *pbVar5 = (byte)uVar7;
      target = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar5 + 1);
      index = index + 1;
    } while (index != iVar1);
  }
  puVar6 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,deterministic,target);
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),puVar6);
    return puVar6;
  }
  return puVar6;
}

Assistant:

::google::protobuf::uint8* FileOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string java_package = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_outer_classname");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      9, this->optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.go_package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        11, this->go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(16, this->cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(18, this->py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(20, this->java_generate_equals_and_hash(), target);
  }

  // optional bool deprecated = 23 [default = false];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(23, this->deprecated(), target);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(27, this->java_string_check_utf8(), target);
  }

  // optional bool cc_enable_arenas = 31 [default = false];
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(31, this->cc_enable_arenas(), target);
  }

  // optional string objc_class_prefix = 36;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->objc_class_prefix().data(), this->objc_class_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.objc_class_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        36, this->objc_class_prefix(), target);
  }

  // optional string csharp_namespace = 37;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->csharp_namespace().data(), this->csharp_namespace().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.csharp_namespace");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        37, this->csharp_namespace(), target);
  }

  // optional string swift_prefix = 39;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->swift_prefix().data(), this->swift_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.swift_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        39, this->swift_prefix(), target);
  }

  // optional string php_class_prefix = 40;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->php_class_prefix().data(), this->php_class_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_class_prefix");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        40, this->php_class_prefix(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileOptions)
  return target;
}